

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void * xmlHashLookup3(xmlHashTablePtr table,xmlChar *name,xmlChar *name2,xmlChar *name3)

{
  _xmlHashEntry *p_Var1;
  _xmlHashEntry **pp_Var2;
  int iVar3;
  unsigned_long uVar4;
  _xmlHashEntry *p_Var5;
  
  if (name != (xmlChar *)0x0 && table != (xmlHashTablePtr)0x0) {
    uVar4 = xmlHashComputeKey(table,name,name2,name3);
    p_Var1 = table->table;
    if (p_Var1[uVar4].valid != 0) {
      if (table->dict != (xmlDictPtr)0x0) {
        p_Var5 = p_Var1 + uVar4;
        if (p_Var1 == (_xmlHashEntry *)0x0) {
          return (void *)0x0;
        }
        do {
          if (((p_Var5->name == name) && (p_Var5->name2 == name2)) && (p_Var5->name3 == name3))
          goto LAB_00149b4f;
          pp_Var2 = &p_Var5->next;
          p_Var5 = *pp_Var2;
        } while (*pp_Var2 != (_xmlHashEntry *)0x0);
      }
      p_Var5 = p_Var1 + uVar4;
      if (p_Var1 != (_xmlHashEntry *)0x0) {
        while (((iVar3 = xmlStrEqual(p_Var5->name,name), iVar3 == 0 ||
                (iVar3 = xmlStrEqual(p_Var5->name2,name2), iVar3 == 0)) ||
               (iVar3 = xmlStrEqual(p_Var5->name3,name3), iVar3 == 0))) {
          pp_Var2 = &p_Var5->next;
          p_Var5 = *pp_Var2;
          if (*pp_Var2 == (_xmlHashEntry *)0x0) {
            return (void *)0x0;
          }
        }
LAB_00149b4f:
        return p_Var5->payload;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *
xmlHashLookup3(xmlHashTablePtr table, const xmlChar *name,
	       const xmlChar *name2, const xmlChar *name3) {
    unsigned long key;
    xmlHashEntryPtr entry;

    if (table == NULL)
	return(NULL);
    if (name == NULL)
	return(NULL);
    key = xmlHashComputeKey(table, name, name2, name3);
    if (table->table[key].valid == 0)
	return(NULL);
    if (table->dict) {
	for (entry = &(table->table[key]); entry != NULL; entry = entry->next) {
	    if ((entry->name == name) &&
		(entry->name2 == name2) &&
		(entry->name3 == name3))
		return(entry->payload);
	}
    }
    for (entry = &(table->table[key]); entry != NULL; entry = entry->next) {
	if ((xmlStrEqual(entry->name, name)) &&
	    (xmlStrEqual(entry->name2, name2)) &&
	    (xmlStrEqual(entry->name3, name3)))
	    return(entry->payload);
    }
    return(NULL);
}